

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::inh_prop(CVmObject *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
                   vm_obj_id_t orig_target_obj,vm_obj_id_t defining_obj,vm_obj_id_t *source_obj,
                   uint *argc)

{
  uint uVar1;
  vm_obj_id_t vVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined2 in_SI;
  long in_RDI;
  undefined4 in_R8D;
  vm_obj_id_t in_R9D;
  vm_obj_id_t *unaff_retaddr;
  uint *in_stack_00000008;
  undefined8 in_stack_00000010;
  uint func_idx;
  undefined8 in_stack_ffffffffffffffa0;
  CVmMetaTable *in_stack_ffffffffffffffa8;
  code *pcVar3;
  CVmMetaclass *in_stack_ffffffffffffffb0;
  CVmMetaTable *pCVar4;
  undefined6 in_stack_ffffffffffffffe8;
  int local_4;
  
  pCVar4 = G_meta_table_X;
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  vVar2 = (vm_obj_id_t)((ulong)pCVar4 >> 0x20);
  uVar1 = CVmMetaTable::prop_to_vector_idx
                    (in_stack_ffffffffffffffa8,(uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     (vm_prop_id_t)((ulong)in_stack_ffffffffffffffa0 >> 0x10));
  if (uVar1 == 0) {
    local_4 = find_modifier_prop((CVmObject *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),
                                 (vm_prop_id_t)((ulong)in_RDX >> 0x30),
                                 (vm_val_t *)CONCAT44(in_ECX,in_R8D),in_R9D,0,vVar2,unaff_retaddr,
                                 in_stack_00000008);
  }
  else {
    vVar2 = CVmMetaclass::get_class_obj(in_stack_ffffffffffffffb0);
    *in_stack_00000008 = vVar2;
    pcVar3 = (code *)func_table_[(ulong)uVar1 * 2];
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *(long *)(in_RDI + func_table_[(ulong)uVar1 * 2 + 1]) + -1);
    }
    local_4 = (*pcVar3)((long *)(in_RDI + func_table_[(ulong)uVar1 * 2 + 1]),in_ECX,in_RDX,
                        in_stack_00000010,in_SI,in_stack_00000008);
  }
  return local_4;
}

Assistant:

int CVmObject::inh_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                        vm_obj_id_t self, vm_obj_id_t orig_target_obj,
                        vm_obj_id_t defining_obj, vm_obj_id_t *source_obj,
                        uint *argc)
{
    uint func_idx;

    /*
     *   We're inheriting.  This is never called from native code, as native
     *   code does its inheriting directly through C++ calls to base class
     *   native code; hence, we can only be called from a byte-code modifier
     *   object.
     *   
     *   First, try looking for a native implementation.  We can reach this
     *   point if a byte-code object overrides an intrinsic method, then
     *   inherits from the byte-code override.  
     */
    func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);
    if (func_idx != 0)
    {
        /* the source object is the 'Object' intrinsic class */
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);

        /* call the native implementation */
        return (this->*func_table_[func_idx])(vmg_ self, retval, argc,
                                              prop, source_obj);
    }

    /*
     *   We didn't find it among the intrinsic methods, so look at the
     *   modifier objects.  
     */
    return find_modifier_prop(vmg_ prop, retval, self, orig_target_obj,
                              defining_obj, source_obj, argc);
}